

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

MontgomeryPoint * ecc_montgomery_point_copy(MontgomeryPoint *orig)

{
  MontgomeryCurve *pMVar1;
  MontgomeryPoint *pMVar2;
  mp_int *pmVar3;
  
  pMVar1 = orig->mc;
  pMVar2 = (MontgomeryPoint *)safemalloc(1,0x18,0);
  pMVar2->mc = pMVar1;
  pMVar2->X = (mp_int *)0x0;
  pMVar2->Z = (mp_int *)0x0;
  pmVar3 = mp_copy(orig->X);
  pMVar2->X = pmVar3;
  pmVar3 = mp_copy(orig->Z);
  pMVar2->Z = pmVar3;
  return pMVar2;
}

Assistant:

MontgomeryPoint *ecc_montgomery_point_copy(MontgomeryPoint *orig)
{
    MontgomeryPoint *mp = ecc_montgomery_point_new_empty(orig->mc);
    mp->X = mp_copy(orig->X);
    mp->Z = mp_copy(orig->Z);
    return mp;
}